

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O0

int __thiscall
Fl_Text_Display::position_to_linecol(Fl_Text_Display *this,int pos,int *lineNum,int *column)

{
  int iVar1;
  int iVar2;
  Fl_Text_Buffer *pFVar3;
  Fl_Text_Buffer *this_00;
  int retVal;
  int *column_local;
  int *lineNum_local;
  int pos_local;
  Fl_Text_Display *this_local;
  
  if (this->mContinuousWrap == 0) {
    this_local._4_4_ = position_to_line(this,pos,lineNum);
    if (this_local._4_4_ != 0) {
      iVar1 = Fl_Text_Buffer::count_displayed_characters
                        (this->mBuffer,this->mLineStarts[*lineNum],pos);
      *column = iVar1;
      *lineNum = this->mTopLineNum + *lineNum;
    }
  }
  else {
    iVar1 = maintaining_absolute_top_line_number(this);
    if (((iVar1 == 0) || (pos < this->mFirstChar)) || (this->mLastChar < pos)) {
      this_local._4_4_ = 0;
    }
    else {
      iVar1 = this->mAbsTopLineNum;
      pFVar3 = buffer(this);
      iVar2 = Fl_Text_Buffer::count_lines(pFVar3,this->mFirstChar,pos);
      *lineNum = iVar1 + iVar2;
      pFVar3 = buffer(this);
      this_00 = buffer(this);
      iVar1 = Fl_Text_Buffer::line_start(this_00,pos);
      iVar1 = Fl_Text_Buffer::count_displayed_characters(pFVar3,iVar1,pos);
      *column = iVar1;
      this_local._4_4_ = 1;
    }
  }
  return this_local._4_4_;
}

Assistant:

int Fl_Text_Display::position_to_linecol( int pos, int* lineNum, int* column ) const {
  IS_UTF8_ALIGNED2(buffer(), pos)

  int retVal;

  /* In continuous wrap mode, the absolute (non-wrapped) line count is
   maintained separately, as needed.  Only return it if we're actually
   keeping track of it and pos is in the displayed text */
  if (mContinuousWrap) {
    if (!maintaining_absolute_top_line_number() || pos < mFirstChar || pos > mLastChar)
      return 0;
    *lineNum = mAbsTopLineNum + buffer()->count_lines(mFirstChar, pos);
    *column = buffer()->count_displayed_characters(buffer()->line_start(pos), pos);
    return 1;
  }

  retVal = position_to_line( pos, lineNum );
  if ( retVal ) {
    *column = mBuffer->count_displayed_characters( mLineStarts[ *lineNum ], pos );
    *lineNum += mTopLineNum;
  }
  return retVal;
}